

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_reduce_is_2k(mp_int *a)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar4 = a->used;
  iVar3 = iVar4;
  if ((1 < (ulong)(long)iVar4) && (iVar3 = 1, 1 < iVar4)) {
    iVar5 = (iVar4 + -1) * 0x3c;
    uVar7 = a->dp[(long)iVar4 - 1];
    lVar2 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar4 = (iVar5 + 0x40) - ((uint)lVar2 ^ 0x3f);
    if (uVar7 == 0) {
      iVar4 = iVar5;
    }
    if (0x3c < iVar4) {
      iVar4 = iVar4 + -0x3c;
      uVar6 = 1;
      uVar7 = 1;
      do {
        if ((a->dp[uVar6] & uVar7) == 0) {
          return 0;
        }
        uVar7 = uVar7 * 2;
        bVar1 = uVar7 >> 0x3c != 0;
        if (bVar1) {
          uVar7 = 1;
        }
        uVar6 = uVar6 + bVar1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      return 1;
    }
  }
  return iVar3;
}

Assistant:

int mp_reduce_is_2k(mp_int *a)
{
   int ix, iy, iw;
   mp_digit iz;
   
   if (a->used == 0) {
      return MP_NO;
   } else if (a->used == 1) {
      return MP_YES;
   } else if (a->used > 1) {
      iy = mp_count_bits(a);
      iz = 1;
      iw = 1;
    
      /* Test every bit from the second digit up, must be 1 */
      for (ix = DIGIT_BIT; ix < iy; ix++) {
          if ((a->dp[iw] & iz) == 0) {
             return MP_NO;
          }
          iz <<= 1;
          if (iz > (mp_digit)MP_MASK) {
             ++iw;
             iz = 1;
          }
      }
   }
   return MP_YES;
}